

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  pair<unsigned_long,_bool> pVar9;
  
  pbVar2 = this->buffer_;
  pbVar6 = this->buffer_end_;
  if (((int)pbVar6 - (int)pbVar2 < 10) && ((pbVar6 <= pbVar2 || ((char)pbVar6[-1] < '\0')))) {
    pVar9 = ReadVarint64Fallback(this);
    iVar5 = (int)pVar9.first;
    if (0x7fffffff < pVar9.first) {
      iVar5 = -1;
    }
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return iVar5;
    }
    return -1;
  }
  bVar1 = *pbVar2;
  uVar4 = (uint)bVar1;
  uVar7 = 0;
  if ((char)bVar1 < '\0') {
    uVar4 = ((uint)bVar1 + (uint)pbVar2[1] * 0x80) - 0x80;
    if (-1 < (char)pbVar2[1]) {
      pbVar6 = pbVar2 + 2;
      goto LAB_0032ef2e;
    }
    uVar4 = (uVar4 + (uint)pbVar2[2] * 0x4000) - 0x4000;
    if (-1 < (char)pbVar2[2]) {
      pbVar6 = pbVar2 + 3;
      goto LAB_0032ef2e;
    }
    iVar5 = uVar4 + (uint)pbVar2[3] * 0x200000;
    uVar4 = iVar5 - 0x200000;
    if (-1 < (char)pbVar2[3]) {
      pbVar6 = pbVar2 + 4;
      goto LAB_0032ef2e;
    }
    uVar4 = iVar5 + 0xefe00000;
    uVar8 = (uint)pbVar2[4];
    if ((char)pbVar2[4] < '\0') {
      uVar8 = (uVar8 + (uint)pbVar2[5] * 0x80) - 0x80;
      if ((char)pbVar2[5] < '\0') {
        uVar8 = (uVar8 + (uint)pbVar2[6] * 0x4000) - 0x4000;
        if ((char)pbVar2[6] < '\0') {
          iVar5 = uVar8 + (uint)pbVar2[7] * 0x200000;
          uVar8 = iVar5 - 0x200000;
          if ((char)pbVar2[7] < '\0') {
            uVar8 = iVar5 + 0xefe00000;
            bVar1 = pbVar2[8];
            uVar7 = (ulong)bVar1;
            if ((char)bVar1 < '\0') {
              pbVar6 = pbVar2 + 10;
              if ((char)pbVar2[9] < '\0') {
                bVar3 = false;
                goto LAB_0032ef45;
              }
              uVar7 = (ulong)(((uint)bVar1 + (uint)pbVar2[9] * 0x80) - 0x80);
            }
            else {
              pbVar6 = pbVar2 + 9;
            }
          }
          else {
            pbVar6 = pbVar2 + 8;
          }
        }
        else {
          pbVar6 = pbVar2 + 7;
        }
      }
      else {
        pbVar6 = pbVar2 + 6;
      }
    }
    else {
      pbVar6 = pbVar2 + 5;
    }
  }
  else {
    pbVar6 = pbVar2 + 1;
LAB_0032ef2e:
    uVar8 = 0;
  }
  uVar7 = uVar7 << 0x38 | (ulong)uVar8 << 0x1c | (ulong)uVar4;
  bVar3 = true;
LAB_0032ef45:
  iVar5 = -1;
  if ((bVar3) && (uVar7 < 0x80000000)) {
    this->buffer_ = pbVar6;
    iVar5 = (int)uVar7;
  }
  return iVar5;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64 temp;
    ::std::pair<bool, const uint8*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}